

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  mapped_type *pmVar1;
  OneofDescriptor *pOVar2;
  FieldGeneratorBase *pFVar3;
  Descriptor *pDVar4;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *descriptor;
  FieldDescriptor *extraout_RDX_00;
  int i;
  long lVar5;
  csharp *this_00;
  long lVar6;
  long lVar7;
  allocator local_c9;
  MessageGenerator *local_c8;
  string local_c0;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_(&local_c0,this);
  std::__cxx11::string::string((string *)&local_80,"class_name",&local_c9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_80);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_c8->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,"public void MergeFrom($class_name$ other) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (other == null) {\n  return;\n}\n");
  lVar6 = 0;
  for (lVar5 = 0; pDVar4 = local_c8->descriptor_, lVar5 < *(int *)(pDVar4 + 4); lVar5 = lVar5 + 1) {
    lVar7 = *(long *)(pDVar4 + 0x28);
    pOVar2 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)(lVar7 + lVar6));
    if (pOVar2 == (OneofDescriptor *)0x0) {
      pFVar3 = CreateFieldGeneratorInternal(local_c8,(FieldDescriptor *)(lVar7 + lVar6));
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar3,printer);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
    }
    lVar6 = lVar6 + 0x48;
  }
  lVar5 = 0;
  while (lVar5 < *(int *)(pDVar4 + 0x6c)) {
    lVar6 = *(long *)(pDVar4 + 0x30);
    UnderscoresToCamelCase(&local_c0,*(string **)(lVar6 + 8 + lVar5 * 0x28),false);
    std::__cxx11::string::string((string *)&local_80,"name",&local_c9);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    lVar6 = lVar6 + lVar5 * 0x28;
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    UnderscoresToCamelCase(&local_c0,*(string **)(lVar6 + 8),true);
    std::__cxx11::string::string((string *)&local_80,"property_name",&local_c9);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_80);
    local_a0 = lVar5;
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    io::Printer::Print(printer,&vars,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent(printer);
    lVar7 = 0;
    lVar5 = 0;
    descriptor = extraout_RDX;
    local_98 = lVar6;
    while (lVar5 < *(int *)(local_98 + 4)) {
      this_00 = (csharp *)(*(long *)(local_98 + 0x20) + lVar7);
      local_88 = lVar5;
      GetPropertyName_abi_cxx11_(&local_c0,this_00,descriptor);
      std::__cxx11::string::string((string *)&local_80,"field_property_name",&local_c9);
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_80);
      local_90 = lVar7;
      std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_c0);
      io::Printer::Print(printer,&vars,"case $property_name$OneofCase.$field_property_name$:\n");
      io::Printer::Indent(printer);
      pFVar3 = CreateFieldGeneratorInternal(local_c8,(FieldDescriptor *)this_00);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar3,printer);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      (*(pFVar3->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar3);
      lVar7 = local_90 + 0x48;
      descriptor = extraout_RDX_00;
      lVar5 = local_88 + 1;
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n\n");
    pDVar4 = local_c8->descriptor_;
    lVar5 = local_a0 + 1;
  }
  if (local_c8->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }
  io::Printer::Print<>
            (printer,
             "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n"
            );
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_c8->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void MergeFrom(pb::CodedInputStream input) {\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"input.ReadRawMessage(this);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#else\n");
  io::Printer::Indent(printer);
  GenerateMainParseLoop(local_c8,printer,false);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"#endif\n");
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print<>(printer,"#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_c8->super_SourceGeneratorBase,printer);
  io::Printer::Print<>
            (printer,"void pb::IBufferMessage.InternalMergeFrom(ref pb::ParseContext input) {\n");
  io::Printer::Indent(printer);
  GenerateMainParseLoop(local_c8,printer,true);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endif\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  std::map<std::string, std::string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields, treating optional proto3 fields as normal fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->real_containing_oneof()) {
      continue;
    }
    std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
    generator->GenerateMergingCode(printer);
  }
  // Merge oneof fields (for non-synthetic oneofs)
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["name"] = UnderscoresToCamelCase(oneof->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(oneof->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      generator->GenerateMergingCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Merge extensions
  if (has_extension_ranges_) {
    printer->Print("pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }

  // Merge unknown fields.
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n");

  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("input.ReadRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateMainParseLoop(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print("void pb::IBufferMessage.InternalMergeFrom(ref pb::ParseContext input) {\n");
  printer->Indent();
  GenerateMainParseLoop(printer, true);
  printer->Outdent();
  printer->Print("}\n"); // method
  printer->Print("#endif\n\n");

}